

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinSplitLimit
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *this_00;
  pointer pVVar1;
  HeapEntity *pHVar2;
  HeapEntity *pHVar3;
  ulong uVar4;
  Interpreter *pIVar5;
  bool bVar6;
  HeapThunk *pHVar7;
  allocator_type *in_RCX;
  int *args_2;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *params;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar11;
  HeapThunk *th;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_b8;
  Identifier **local_98;
  HeapEntity *local_90;
  Interpreter *local_88;
  HeapEntity *local_80;
  ulong local_78;
  Value local_70;
  HeapEntity *local_60;
  ulong local_58;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_50;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"splitLimit",(allocator<char> *)&th);
  local_70.t = STRING;
  local_70._4_4_ = 0x13;
  local_70.v._0_4_ = 2;
  __l._M_len = 3;
  __l._M_array = &local_70.t;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)&local_48,__l,in_RCX);
  params = &local_48;
  validateBuiltinArgs(this,loc,(string *)&local_b8,args,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                       *)params);
  std::
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~_Vector_base(&local_48);
  std::__cxx11::string::~string((string *)&local_b8);
  pVVar1 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pHVar2 = (pVVar1->v).h;
  pHVar3 = pVVar1[1].v.h;
  local_78 = (ulong)pVVar1[2].v.d;
  local_b8._M_dataplus._M_p = (pointer)0x0;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_allocated_capacity = 0;
  VVar11 = makeArray(this,(vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                           *)&local_b8);
  (this->scratch).t = ARRAY;
  (this->scratch).v = VVar11._0_8_;
  std::
  _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ::~_Vector_base((_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   *)&local_b8);
  local_60 = (this->scratch).v.h;
  local_90 = local_60 + 1;
  this_00 = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
            (pHVar2 + 1);
  local_50 = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             (pHVar3 + 1);
  local_98 = &this->idArrayElement;
  uVar10 = 0;
  local_88 = this;
  local_80 = pHVar3;
  do {
    uVar8 = 0;
    uVar9 = uVar10;
    while( true ) {
      pIVar5 = local_88;
      uVar4._0_1_ = pHVar2[1].mark;
      uVar4._1_1_ = pHVar2[1].type;
      uVar4._2_6_ = *(undefined6 *)&pHVar2[1].field_0xa;
      if ((uVar4 <= uVar9) ||
         ((local_78 != 0xffffffffffffffff &&
          (local_78 <= (ulong)(*(long *)&local_60[1].mark - (long)local_60[1]._vptr_HeapEntity >> 3)
          )))) {
        local_b8._M_dataplus._M_p = local_b8._M_dataplus._M_p & 0xffffffff00000000;
        pHVar7 = (anonymous_namespace)::Interpreter::
                 makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                           ((Interpreter *)local_88,local_98,(void **)&local_b8,(int *)local_80,
                            (void **)params);
        th = pHVar7;
        std::
        vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
        ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                     *)local_90,&th);
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::substr(&local_b8,this_00,(ulong)uVar10,0xffffffffffffffff);
        VVar11 = makeString(pIVar5,&local_b8);
        local_70.v = VVar11._0_8_;
        local_70.t = STRING;
        HeapThunk::fill(pHVar7,&local_70);
        std::__cxx11::u32string::~u32string((u32string *)&local_b8);
        return (AST *)0x0;
      }
      args_2 = *(int **)&local_80[1].mark;
      local_58 = (ulong)uVar10;
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      substr(&local_b8,this_00,(ulong)uVar9,(size_type)args_2);
      bVar6 = std::operator==(local_50,&local_b8);
      std::__cxx11::u32string::~u32string((u32string *)&local_b8);
      pIVar5 = local_88;
      if (bVar6) break;
      uVar9 = uVar9 + 1;
      uVar8 = uVar8 + 1;
    }
    local_b8._M_dataplus._M_p = local_b8._M_dataplus._M_p & 0xffffffff00000000;
    pHVar7 = (anonymous_namespace)::Interpreter::
             makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                       ((Interpreter *)local_88,local_98,(void **)&local_b8,args_2,(void **)params);
    th = pHVar7;
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                 *)local_90,&th);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    substr(&local_b8,this_00,local_58,(ulong)uVar8);
    VVar11 = makeString(pIVar5,&local_b8);
    local_70.v = VVar11._0_8_;
    local_70.t = STRING;
    HeapThunk::fill(pHVar7,&local_70);
    std::__cxx11::u32string::~u32string((u32string *)&local_b8);
    uVar10 = uVar9 + *(int *)&local_80[1].mark;
  } while( true );
}

Assistant:

const AST *builtinSplitLimit(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "splitLimit", args, {Value::STRING, Value::STRING, Value::NUMBER});
        const auto *str = static_cast<const HeapString *>(args[0].v.h);
        const auto *c = static_cast<const HeapString *>(args[1].v.h);
        long maxsplits = long(args[2].v.d);
        unsigned start = 0;
        unsigned test = 0;
        scratch = makeArray({});
        auto &elements = static_cast<HeapArray *>(scratch.v.h)->elements;
        while (test < str->value.size() && (maxsplits == -1 ||
                                            size_t(maxsplits) > elements.size())) {
            if (c->value == str->value.substr(test, c->value.size())) {
                auto *th = makeHeap<HeapThunk>(idArrayElement, nullptr, 0, nullptr);
                elements.push_back(th);
                th->fill(makeString(str->value.substr(start, test - start)));
                start = test + c->value.size();
                test = start;
            } else {
                ++test;
            }
        }
        auto *th = makeHeap<HeapThunk>(idArrayElement, nullptr, 0, nullptr);
        elements.push_back(th);
        th->fill(makeString(str->value.substr(start)));

        return nullptr;
    }